

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpcommon.c
# Opt level: O0

_Bool sftp_recv_finish(sftp_packet *pkt)

{
  byte bVar1;
  ptrlen data;
  sftp_packet *pkt_local;
  
  data = make_ptrlen(pkt->data,pkt->length);
  BinarySource_INIT__(pkt->binarysource_,data);
  bVar1 = BinarySource_get_byte(pkt->binarysource_);
  pkt->type = (uint)bVar1;
  return (_Bool)((pkt->binarysource_[0].err != BSE_NO_ERROR ^ 0xffU) & 1);
}

Assistant:

bool sftp_recv_finish(struct sftp_packet *pkt)
{
    BinarySource_INIT(pkt, pkt->data, pkt->length);
    pkt->type = get_byte(pkt);
    return !get_err(pkt);
}